

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

APInt * __thiscall llvm::APInt::operator&=(APInt *this,APInt *RHS)

{
  bool bVar1;
  APInt *RHS_local;
  APInt *this_local;
  
  if (this->BitWidth != RHS->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x318,"APInt &llvm::APInt::operator&=(const APInt &)");
  }
  bVar1 = isSingleWord(this);
  if (bVar1) {
    (this->U).VAL = (RHS->U).VAL & (this->U).VAL;
  }
  else {
    AndAssignSlowCase(this,RHS);
  }
  return this;
}

Assistant:

APInt &operator&=(const APInt &RHS) {
    assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
    if (isSingleWord())
      U.VAL &= RHS.U.VAL;
    else
      AndAssignSlowCase(RHS);
    return *this;
  }